

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidiin.cpp
# Opt level: O3

int anon_unknown.dwarf_1257d::RtMidiIn_callbackwrapper(lua_State *L)

{
  lua_pushvalue(L,0xfff0b9d7);
  lua_pushvalue(L,1);
  lua_pushvalue(L,2);
  lua_pushvalue(L,0xfff0b9d6);
  lua_callk(L,3,0,0,0);
  return 0;
}

Assistant:

int RtMidiIn_callbackwrapper(lua_State *L) {
	lua_pushvalue(L, lua_upvalueindex(1)); // callback
	lua_pushvalue(L, 1);
	lua_pushvalue(L, 2);
	lua_pushvalue(L, lua_upvalueindex(2)); // user data
	lua_call(L, 3, 0);
	return 0;
}